

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O3

bool ON_IntersectLineLine
               (ON_Line *lineA,ON_Line *lineB,double *a,double *b,double tolerance,
               bool bIntersectSegments)

{
  bool bVar1;
  double dVar2;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  
  bVar1 = ON_Intersect(lineA,lineB,a,b);
  if (bVar1) {
    if (bIntersectSegments) {
      dVar2 = 0.0;
      if ((*a < 0.0) || (dVar2 = 1.0, 1.0 < *a)) {
        *a = dVar2;
      }
      dVar2 = 0.0;
      if ((*b < 0.0) || (dVar2 = 1.0, 1.0 < *b)) {
        *b = dVar2;
      }
    }
    bVar1 = true;
    if (0.0 < tolerance) {
      ON_Line::PointAt(&local_40,lineA,*a);
      ON_Line::PointAt(&local_58,lineB,*b);
      dVar2 = ON_3dPoint::DistanceTo(&local_40,&local_58);
      bVar1 = dVar2 <= tolerance;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_IntersectLineLine(
          const ON_Line& lineA, 
          const ON_Line& lineB, 
          double* a,
          double* b,
          double tolerance,
          bool bIntersectSegments
          )
{
  bool rc = ON_Intersect(lineA,lineB,a,b) ? true : false;
  if (rc)
  {
    if ( bIntersectSegments )
    {
      if ( *a < 0.0 )
        *a = 0.0;
      else if ( *a > 1.0 )
        *a = 1.0;
      if ( *b < 0.0 )
        *b = 0.0;
      else if ( *b > 1.0 )
        *b = 1.0;
    }
    if ( tolerance > 0.0 )
    {
      rc = (lineA.PointAt(*a).DistanceTo(lineB.PointAt(*b)) <= tolerance);
    }
  }
  return rc;
}